

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# random-solver.cpp
# Opt level: O1

bool __thiscall
baryonyx::itm::
solver_random_inequalities_101coeff<float,baryonyx::itm::maximize_tag,baryonyx::itm::quadratic_cost_type<float>>
::
compute_update_row<baryonyx::bit_array,std::reverse_iterator<__gnu_cxx::__normal_iterator<int_const*,std::vector<int,std::allocator<int>>>>>
          (solver_random_inequalities_101coeff<float,baryonyx::itm::maximize_tag,baryonyx::itm::quadratic_cost_type<float>>
           *this,bit_array *x,
          reverse_iterator<__gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>_>
          *first,reverse_iterator<__gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>_>
                 *last,float kappa,float delta,float theta)

{
  int iVar1;
  linear_congruential_engine<unsigned_long,_16807UL,_0UL,_2147483647UL> *__g;
  __normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_> _Var2;
  bool bVar3;
  undefined8 uVar4;
  _Head_base<0UL,_baryonyx::sparse_matrix<int>::row_value_*,_false> _Var5;
  bool bVar6;
  undefined8 extraout_RAX;
  long lVar7;
  long lVar8;
  _Head_base<0UL,_int_*,_false> _Var9;
  uint uVar10;
  type it;
  int *piVar11;
  rc_data *prVar12;
  rc_data *ret;
  rc_data *__first;
  long lVar13;
  int iVar14;
  ulong uVar15;
  uint uVar16;
  ulong uVar17;
  long lVar18;
  float fVar19;
  float fVar20;
  double dVar21;
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 in_register_00001304 [12];
  float local_bc;
  undefined1 local_90 [16];
  _Head_base<0UL,_int_*,_false> local_80;
  float local_74;
  _Head_base<0UL,_baryonyx::sparse_matrix<int>::row_value_*,_false> local_70;
  solver_random_inequalities_101coeff<float,baryonyx::itm::maximize_tag,baryonyx::itm::quadratic_cost_type<float>>
  *local_68;
  _Head_base<0UL,_baryonyx::sparse_matrix<int>::col_value_*,_false> local_60;
  reverse_iterator<__gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>_>
  *local_58;
  long local_50;
  long local_48;
  unique_ptr<int[],_std::default_delete<int[]>_> local_40;
  _Head_base<0UL,_int_*,_false> local_38;
  
  if ((first->current)._M_current != (last->current)._M_current) {
    local_68 = this + 8;
    fVar19 = kappa / (1.0 - kappa);
    local_74 = theta;
    local_60._M_head_impl = (col_value *)first;
    local_58 = last;
    do {
      if (*(int *)(this + 0x80) <= (*(int **)local_60._M_head_impl)[-1]) {
        compute_update_row<baryonyx::bit_array,std::reverse_iterator<__gnu_cxx::__normal_iterator<int_const*,std::vector<int,std::allocator<int>>>>>
                  ();
LAB_00151410:
        compute_update_row<baryonyx::bit_array,std::reverse_iterator<__gnu_cxx::__normal_iterator<int_const*,std::vector<int,std::allocator<int>>>>>
                  ();
        __clang_call_terminate(extraout_RAX);
      }
      local_70._M_head_impl = (row_value *)(long)(*(int **)local_60._M_head_impl)[-1];
      sparse_matrix<int>::row((sparse_matrix<int> *)local_90,(int)local_68);
      if (local_90._8_8_ != local_90._0_8_) {
        lVar18 = *(long *)(this + 0x68);
        _Var9._M_head_impl = (int *)local_90._8_8_;
        do {
          *(float *)(lVar18 + (long)*_Var9._M_head_impl * 4) =
               local_74 * *(float *)(lVar18 + (long)*_Var9._M_head_impl * 4);
          _Var9._M_head_impl = _Var9._M_head_impl + 8;
        } while (_Var9._M_head_impl != (int *)local_90._0_8_);
      }
      if (local_90._8_8_ == local_90._0_8_) {
        uVar17 = 0;
      }
      else {
        uVar17 = 0;
        piVar11 = (int *)local_90._8_8_;
        do {
          sparse_matrix<int>::column((sparse_matrix<int> *)&local_40,(int)local_68);
          if ((__uniq_ptr_data<int,_std::default_delete<int[]>,_true,_true>)local_38._M_head_impl ==
              (__uniq_ptr_impl<int,_std::default_delete<int[]>_>)
              local_40._M_t.super___uniq_ptr_impl<int,_std::default_delete<int[]>_>._M_t.
              super__Tuple_impl<0UL,_int_*,_std::default_delete<int[]>_>.
              super__Head_base<0UL,_int_*,_false>._M_head_impl) {
            local_bc = 0.0;
          }
          else {
            auVar23 = ZEXT816(0) << 0x40;
            do {
              auVar22._0_4_ =
                   (float)*(int *)(*(long *)(this + 0x48) + (long)*local_38._M_head_impl * 4);
              auVar22._4_12_ = in_register_00001304;
              auVar23 = vfmadd231ss_fma(auVar23,auVar22,
                                        ZEXT416(*(uint *)(*(long *)(this + 0x68) +
                                                         (long)*local_38._M_head_impl * 4)));
              local_38._M_head_impl = local_38._M_head_impl + 2;
            } while ((__uniq_ptr_data<int,_std::default_delete<int[]>,_true,_true>)
                     local_38._M_head_impl !=
                     (__uniq_ptr_impl<int,_std::default_delete<int[]>_>)
                     local_40._M_t.super___uniq_ptr_impl<int,_std::default_delete<int[]>_>._M_t.
                     super__Tuple_impl<0UL,_int_*,_std::default_delete<int[]>_>.
                     super__Head_base<0UL,_int_*,_false>._M_head_impl);
            local_bc = auVar23._0_4_;
          }
          lVar18 = *(long *)(this + 0x50);
          lVar13 = uVar17 * 0xc;
          *(int *)(lVar18 + 4 + lVar13) = (int)uVar17;
          *(undefined4 *)(lVar18 + 8 + lVar13) =
               *(undefined4 *)(*(long *)(this + 0x48) + (long)*piVar11 * 4);
          fVar20 = quadratic_cost_type<float>::operator()
                             (*(quadratic_cost_type<float> **)(this + 0x70),
                              *(int *)(local_90._8_8_ + 4),x);
          *(float *)(*(long *)(this + 0x50) + lVar13) = fVar20 - local_bc;
          piVar11 = piVar11 + 2;
          uVar17 = uVar17 + 1;
        } while (piVar11 != (int *)local_90._0_8_);
      }
      uVar16 = (uint)uVar17;
      local_80._M_head_impl = (int *)(uVar17 & 0xffffffff);
      if (1 < uVar16) {
        __g = *(linear_congruential_engine<unsigned_long,_16807UL,_0UL,_2147483647UL> **)this;
        __first = *(rc_data **)(this + 0x50);
        lVar18 = (long)local_80._M_head_impl * 0xc;
        prVar12 = __first + (long)local_80._M_head_impl;
        std::
        __introsort_loop<baryonyx::itm::solver_random_inequalities_101coeff<float,baryonyx::itm::maximize_tag,baryonyx::itm::quadratic_cost_type<float>>::rc_data*,long,__gnu_cxx::__ops::_Iter_comp_iter<baryonyx::itm::calculator_sort<baryonyx::itm::maximize_tag,baryonyx::itm::solver_random_inequalities_101coeff<float,baryonyx::itm::maximize_tag,baryonyx::itm::quadratic_cost_type<float>>::rc_data*>(baryonyx::itm::solver_random_inequalities_101coeff<float,baryonyx::itm::maximize_tag,baryonyx::itm::quadratic_cost_type<float>>::rc_data*,baryonyx::itm::solver_random_inequalities_101coeff<float,baryonyx::itm::maximize_tag,baryonyx::itm::quadratic_cost_type<float>>::rc_data*,std::linear_congruential_engine<unsigned_long,16807ul,0ul,2147483647ul>&)::_lambda(auto:1_const&,auto:2_const&)_1_>>
                  (__first,prVar12,(int)LZCOUNT(local_80._M_head_impl) * 2 ^ 0x7e);
        std::
        __final_insertion_sort<baryonyx::itm::solver_random_inequalities_101coeff<float,baryonyx::itm::maximize_tag,baryonyx::itm::quadratic_cost_type<float>>::rc_data*,__gnu_cxx::__ops::_Iter_comp_iter<baryonyx::itm::calculator_sort<baryonyx::itm::maximize_tag,baryonyx::itm::solver_random_inequalities_101coeff<float,baryonyx::itm::maximize_tag,baryonyx::itm::quadratic_cost_type<float>>::rc_data*>(baryonyx::itm::solver_random_inequalities_101coeff<float,baryonyx::itm::maximize_tag,baryonyx::itm::quadratic_cost_type<float>>::rc_data*,baryonyx::itm::solver_random_inequalities_101coeff<float,baryonyx::itm::maximize_tag,baryonyx::itm::quadratic_cost_type<float>>::rc_data*,std::linear_congruential_engine<unsigned_long,16807ul,0ul,2147483647ul>&)::_lambda(auto:1_const&,auto:2_const&)_1_>>
                  (__first,prVar12);
        prVar12 = __first + 1;
        lVar18 = lVar18 + -0xc;
        do {
          if ((__first->value != prVar12->value) || (NAN(__first->value) || NAN(prVar12->value))) {
            std::
            shuffle<baryonyx::itm::solver_random_inequalities_101coeff<float,baryonyx::itm::maximize_tag,baryonyx::itm::quadratic_cost_type<float>>::rc_data*,std::linear_congruential_engine<unsigned_long,16807ul,0ul,2147483647ul>&>
                      (__first,prVar12,__g);
            __first = prVar12;
          }
          prVar12 = prVar12 + 1;
          lVar18 = lVar18 + -0xc;
        } while (lVar18 != 0);
        std::
        shuffle<baryonyx::itm::solver_random_inequalities_101coeff<float,baryonyx::itm::maximize_tag,baryonyx::itm::quadratic_cost_type<float>>::rc_data*,std::linear_congruential_engine<unsigned_long,16807ul,0ul,2147483647ul>&>
                  (__first,prVar12,__g);
        uVar16 = (uint)local_80._M_head_impl;
      }
      _Var5._M_head_impl = local_70._M_head_impl;
      if (*(int *)(*(long *)(this + 0x58) + (long)local_70._M_head_impl * 0xc) < 1) {
        iVar14 = 0;
        uVar17 = 0xffffffff;
      }
      else {
        lVar18 = 0;
        iVar14 = 0;
        uVar15 = 0xffffffffffffffff;
        do {
          uVar4 = local_90._8_8_;
          uVar17 = uVar15 + 1;
          iVar14 = iVar14 + *(int *)(*(long *)(this + 0x50) + 8 + lVar18);
          iVar1 = *(int *)(*(long *)(this + 0x58) + (long)_Var5._M_head_impl * 0xc);
          lVar13 = (long)*(int *)(*(long *)(this + 0x50) + 4 + lVar18);
          bit_array_impl::set(&x->super_bit_array_impl,
                              *(int *)(local_90._8_8_ + (lVar13 * 2 + 1) * 4));
          auVar23 = vfmadd213ss_fma(ZEXT416((uint)(*(float *)(*(long *)(this + 0x50) + lVar18) * 0.5
                                                  )),ZEXT416((uint)fVar19),ZEXT416((uint)delta));
          *(float *)(*(long *)(this + 0x68) + (long)*(int *)(uVar4 + lVar13 * 2 * 4) * 4) =
               auVar23._0_4_ +
               *(float *)(*(long *)(this + 0x68) + (long)*(int *)(uVar4 + lVar13 * 2 * 4) * 4);
          if (iVar1 <= iVar14) break;
          lVar18 = lVar18 + 0xc;
          bVar6 = (long)uVar15 < (long)(int)uVar16 + -2;
          uVar15 = uVar17;
        } while (bVar6);
        uVar16 = (uint)local_80._M_head_impl;
      }
      uVar10 = (uint)uVar17;
      if (iVar14 < *(int *)(*(long *)(this + 0x58) + (long)_Var5._M_head_impl * 0xc)) {
        bVar6 = false;
      }
      else {
        bVar6 = iVar14 <= *(int *)(*(long *)(this + 0x58) + (long)_Var5._M_head_impl * 0xc + 4);
      }
      if (((int)(uVar10 + 1) < (int)uVar16) && (bVar6)) {
        local_48 = (long)(int)uVar16;
        lVar18 = (long)(int)uVar10 * 0xc;
        lVar13 = (long)(int)uVar10 + 2;
        do {
          uVar4 = local_90._8_8_;
          lVar8 = *(long *)(this + 0x50);
          iVar14 = iVar14 + *(int *)(lVar8 + 0x14 + lVar18);
          if (iVar14 < *(int *)(*(long *)(this + 0x58) + (long)_Var5._M_head_impl * 0xc)) {
            bVar6 = false;
          }
          else {
            bVar6 = iVar14 <= *(int *)(*(long *)(this + 0x58) + (long)_Var5._M_head_impl * 0xc + 4);
          }
          lVar7 = (long)*(int *)(lVar8 + 0x10 + lVar18);
          if (bVar6) {
            fVar20 = *(float *)(lVar8 + 0xc + lVar18);
            if ((fVar20 != 0.0) || (NAN(fVar20))) {
              bVar6 = fVar20 < 0.0;
            }
            else {
              local_50 = lVar7;
              dVar21 = std::
                       generate_canonical<double,53ul,std::linear_congruential_engine<unsigned_long,16807ul,0ul,2147483647ul>>
                                 (*(linear_congruential_engine<unsigned_long,_16807UL,_0UL,_2147483647UL>
                                    **)this);
              bVar6 = dVar21 < 0.5;
              lVar7 = local_50;
            }
          }
          if (bVar6) {
            bit_array_impl::set(&x->super_bit_array_impl,*(int *)(uVar4 + (lVar7 * 2 + 1) * 4));
            lVar8 = *(long *)(this + 0x68);
            auVar23 = vfmadd213ss_fma(ZEXT416((uint)(*(float *)(*(long *)(this + 0x50) + 0xc +
                                                               lVar18) * 0.5)),ZEXT416((uint)fVar19)
                                      ,ZEXT416((uint)delta));
            lVar7 = (long)*(int *)(uVar4 + lVar7 * 2 * 4);
            fVar20 = auVar23._0_4_ + *(float *)(lVar8 + lVar7 * 4);
          }
          else {
            bit_array_impl::unset(&x->super_bit_array_impl,*(int *)(uVar4 + (lVar7 * 2 + 1) * 4));
            lVar8 = *(long *)(this + 0x68);
            auVar23 = vfmadd213ss_fma(ZEXT416((uint)(*(float *)(*(long *)(this + 0x50) + 0xc +
                                                               lVar18) * 0.5)),ZEXT416((uint)fVar19)
                                      ,ZEXT416((uint)delta));
            lVar7 = (long)*(int *)(uVar4 + lVar7 * 2 * 4);
            fVar20 = *(float *)(lVar8 + lVar7 * 4) - auVar23._0_4_;
          }
          *(float *)(lVar8 + lVar7 * 4) = fVar20;
          bVar3 = lVar13 < local_48;
          uVar10 = (int)uVar17 + 1;
          uVar17 = (ulong)uVar10;
          lVar18 = lVar18 + 0xc;
          lVar13 = lVar13 + 1;
        } while ((bool)(bVar3 & bVar6));
      }
      if ((int)(uVar10 + 1) < (int)local_80._M_head_impl) {
        lVar18 = (long)(int)uVar10 * 0xc;
        iVar14 = ~uVar10 + (int)local_80._M_head_impl;
        do {
          uVar4 = local_90._8_8_;
          lVar13 = (long)*(int *)(*(long *)(this + 0x50) + 0x10 + lVar18);
          bit_array_impl::unset
                    (&x->super_bit_array_impl,*(int *)(local_90._8_8_ + (lVar13 * 2 + 1) * 4));
          auVar23 = vfmadd213ss_fma(ZEXT416((uint)(*(float *)(*(long *)(this + 0x50) + 0xc + lVar18)
                                                  * 0.5)),ZEXT416((uint)fVar19),ZEXT416((uint)delta)
                                   );
          *(float *)(*(long *)(this + 0x68) + (long)*(int *)(uVar4 + lVar13 * 2 * 4) * 4) =
               *(float *)(*(long *)(this + 0x68) + (long)*(int *)(uVar4 + lVar13 * 2 * 4) * 4) -
               auVar23._0_4_;
          lVar18 = lVar18 + 0xc;
          iVar14 = iVar14 + -1;
        } while (iVar14 != 0);
      }
      bVar6 = is_valid_constraint<baryonyx::itm::solver_random_inequalities_101coeff<float,baryonyx::itm::maximize_tag,baryonyx::itm::quadratic_cost_type<float>>,baryonyx::bit_array>
                        ((solver_random_inequalities_101coeff<float,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<float>_>
                          *)this,(int)local_70._M_head_impl,x);
      if (!bVar6) goto LAB_00151410;
      _Var2._M_current = *(int **)local_60._M_head_impl;
      *local_60._M_head_impl = (col_value)(_Var2._M_current + -1);
    } while (_Var2._M_current + -1 != (local_58->current)._M_current);
  }
  return false;
}

Assistant:

bool compute_update_row(Xtype& x,
                            Iterator first,
                            Iterator last,
                            Float kappa,
                            Float delta,
                            Float theta)
    {
        for (; first != last; ++first) {
            auto k = constraint(first);
            bx_expects(k < m);

            auto [row_begin, row_end] = ap.row(k);
            decrease_preference(row_begin, row_end, theta);

            int r_size = 0;
            for (auto it = row_begin; it != row_end; ++it, ++r_size) {
                Float sum_a_p = 0;

                auto [col_begin, col_end] = ap.column(it->column);
                for (; col_begin != col_end; ++col_begin)
                    sum_a_p += static_cast<Float>(A[col_begin->value]) *
                               P[col_begin->value];

                R[r_size].id = r_size;
                R[r_size].a = A[it->value];
                R[r_size].value = c(row_begin->column, x) - sum_a_p;
            }

            calculator_sort<Mode>(R.get(), R.get() + r_size, rng);

            int value = 0;
            bool valid = b[k].min <= 0;
            int i = -1;

            // if (!valid) {
            //     do {
            //         ++i;
            //         value += R[i].a;
            //         valid = b[k].min <= value;
            //     } while (!valid && i + 1 < r_size);
            // }

            // valid = b[k].min <= value && value <= b[k].max;
            // while (i + 1 < r_size && valid) {
            //     ++i;
            //     value += R[i].a;
            //     valid = b[k].min <= value && value <= b[k].max;
            // }

            // std::uniform_real_distribution<Float> real_dist(Float{ 0 },
            //                                                 Float{ 1 });

            // auto selected = i;
            // auto d = delta;

            // if (selected < 0) {
            //     d += (kappa / (one - kappa)) * (R[0].value / two);
            //     d *= real_dist(rng);

            //     for (i = 0; i != r_size; ++i) {
            //         auto var = row_begin + R[i].id;

            //         if (R[i].is_negative()) {
            //             x.set(var->column, 1);
            //             P[var->value] += d;
            //         } else {
            //             x.set(var->column, 0);
            //             P[var->value] -= d;
            //         }
            //     }
            // } else if (selected + 1 >= r_size) {
            //     d += (kappa / (one - kappa)) * (R[selected].value * middle);
            //     d *= real_dist(rng);

            //     for (i = 0; i != r_size; ++i) {
            //         auto var = row_begin + R[i].id;

            //         if (R[i].is_negative()) {
            //             x.set(var->column, 0);
            //             P[var->value] -= d;
            //         } else {
            //             x.set(var->column, 1);
            //             P[var->value] += d;
            //         }
            //     }
            // } else {
            //     d += (kappa / (one - kappa)) *
            //          (R[selected + 1].value - R[selected].value);
            //     d *= real_dist(rng);

            //     for (i = 0; i <= selected; ++i) {
            //         auto var = row_begin + R[i].id;

            //         if (R[i].is_negative()) {
            //             x.set(var->column, 0);
            //             P[var->value] -= d;
            //         } else {
            //             x.set(var->column, 1);
            //             P[var->value] += d;
            //         }
            //     }

            //     for (; i != r_size; ++i) {
            //         auto var = row_begin + R[i].id;

            //         if (R[i].is_negative()) {
            //             x.set(var->column, 1);
            //             P[var->value] += d;
            //         } else {
            //             x.set(var->column, 0);
            //             P[var->value] -= d;
            //         }
            //     }

            constexpr Float one{ 1 };
            constexpr Float two{ 2 };

            if (!valid) {
                do {
                    ++i;
                    value += R[i].a;
                    valid = b[k].min <= value;
                    auto var = row_begin + R[i].id;
                    x.set(var->column);
                    P[var->value] +=
                      delta + (kappa / (one - kappa)) * (R[i].value / two);
                } while (!valid && i + 1 < r_size);
            }

            valid = b[k].min <= value && value <= b[k].max;
            while (i + 1 < r_size && valid) {
                ++i;
                value += R[i].a;
                valid = b[k].min <= value && value <= b[k].max;
                auto var = row_begin + R[i].id;

                if (valid)
                    valid = stop_iterating<Mode>(R[i].value, rng);

                if (valid) {
                    x.set(var->column);
                    P[var->value] +=
                      delta + (kappa / (one - kappa)) * (R[i].value / two);
                } else {
                    x.unset(var->column);
                    P[var->value] -=
                      delta + (kappa / (one - kappa)) * (R[i].value / two);
                }
            }

            while (i + 1 < r_size) {
                ++i;
                auto var = row_begin + R[i].id;
                x.unset(var->column);
                P[var->value] -=
                  delta + (kappa / (one - kappa)) * (R[i].value / two);
            }

            bx_expects(is_valid_constraint(*this, k, x));
        }

        return false;
    }